

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

void PredictorSub11_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  
  uVar24 = 0;
  if (3 < num_pixels) {
    uVar23 = 0;
    do {
      auVar30 = *(undefined1 (*) [16])(upper + (uVar23 - 1));
      auVar3 = *(undefined1 (*) [16])(upper + uVar23);
      auVar4 = *(undefined1 (*) [16])(in + (uVar23 - 1));
      puVar1 = in + uVar23;
      cVar6 = *(char *)((long)puVar1 + 1);
      cVar7 = *(char *)((long)puVar1 + 2);
      cVar8 = *(char *)((long)puVar1 + 3);
      uVar18 = puVar1[1];
      cVar9 = *(char *)((long)puVar1 + 5);
      cVar10 = *(char *)((long)puVar1 + 6);
      cVar11 = *(char *)((long)puVar1 + 7);
      uVar19 = puVar1[2];
      cVar12 = *(char *)((long)puVar1 + 9);
      cVar13 = *(char *)((long)puVar1 + 10);
      cVar14 = *(char *)((long)puVar1 + 0xb);
      uVar20 = puVar1[3];
      cVar15 = *(char *)((long)puVar1 + 0xd);
      cVar16 = *(char *)((long)puVar1 + 0xe);
      cVar17 = *(char *)((long)puVar1 + 0xf);
      uVar25 = auVar3._0_4_;
      uVar26 = auVar3._4_4_;
      uVar27 = auVar3._8_4_;
      uVar28 = auVar3._12_4_;
      auVar32._0_8_ = auVar30._0_8_;
      auVar32._8_4_ = auVar30._4_4_;
      auVar32._12_4_ = uVar26;
      auVar31._8_8_ = auVar32._8_8_;
      auVar31._0_4_ = auVar30._0_4_;
      auVar31._4_4_ = uVar25;
      auVar33._4_4_ = uVar25;
      auVar33._0_4_ = uVar25;
      auVar33._8_4_ = uVar26;
      auVar33._12_4_ = uVar26;
      auVar33 = psadbw(auVar31,auVar33);
      auVar34._4_4_ = uVar27;
      auVar34._0_4_ = auVar30._8_4_;
      auVar34._8_4_ = auVar30._12_4_;
      auVar34._12_4_ = uVar28;
      auVar35._4_4_ = uVar27;
      auVar35._0_4_ = uVar27;
      auVar35._8_4_ = uVar28;
      auVar35._12_4_ = uVar28;
      auVar35 = psadbw(auVar34,auVar35);
      auVar33 = packssdw(auVar33,auVar35);
      uVar25 = auVar4._0_4_;
      uVar26 = auVar4._4_4_;
      uVar27 = auVar4._8_4_;
      uVar28 = auVar4._12_4_;
      auVar37._8_4_ = auVar30._4_4_;
      auVar37._0_8_ = auVar32._0_8_;
      auVar37._12_4_ = uVar26;
      auVar36._8_8_ = auVar37._8_8_;
      auVar36._4_4_ = uVar25;
      auVar36._0_4_ = auVar31._0_4_;
      auVar5._4_4_ = uVar25;
      auVar5._0_4_ = uVar25;
      auVar5._8_4_ = uVar26;
      auVar5._12_4_ = uVar26;
      auVar35 = psadbw(auVar36,auVar5);
      auVar29._4_4_ = uVar27;
      auVar29._0_4_ = auVar30._8_4_;
      auVar29._8_4_ = auVar30._12_4_;
      auVar29._12_4_ = uVar28;
      auVar30._4_4_ = uVar27;
      auVar30._0_4_ = uVar27;
      auVar30._8_4_ = uVar28;
      auVar30._12_4_ = uVar28;
      auVar30 = psadbw(auVar29,auVar30);
      auVar30 = packssdw(auVar35,auVar30);
      auVar38._0_4_ = -(uint)(auVar33._0_4_ < auVar30._0_4_);
      auVar38._4_4_ = -(uint)(auVar33._4_4_ < auVar30._4_4_);
      auVar38._8_4_ = -(uint)(auVar33._8_4_ < auVar30._8_4_);
      auVar38._12_4_ = -(uint)(auVar33._12_4_ < auVar30._12_4_);
      auVar30 = ~auVar38 & auVar3 | auVar4 & auVar38;
      puVar2 = out + uVar23;
      *(char *)puVar2 = (char)*puVar1 - auVar30[0];
      *(char *)((long)puVar2 + 1) = cVar6 - auVar30[1];
      *(char *)((long)puVar2 + 2) = cVar7 - auVar30[2];
      *(char *)((long)puVar2 + 3) = cVar8 - auVar30[3];
      *(char *)(puVar2 + 1) = (char)uVar18 - auVar30[4];
      *(char *)((long)puVar2 + 5) = cVar9 - auVar30[5];
      *(char *)((long)puVar2 + 6) = cVar10 - auVar30[6];
      *(char *)((long)puVar2 + 7) = cVar11 - auVar30[7];
      *(char *)(puVar2 + 2) = (char)uVar19 - auVar30[8];
      *(char *)((long)puVar2 + 9) = cVar12 - auVar30[9];
      *(char *)((long)puVar2 + 10) = cVar13 - auVar30[10];
      *(char *)((long)puVar2 + 0xb) = cVar14 - auVar30[0xb];
      *(char *)(puVar2 + 3) = (char)uVar20 - auVar30[0xc];
      *(char *)((long)puVar2 + 0xd) = cVar15 - auVar30[0xd];
      *(char *)((long)puVar2 + 0xe) = cVar16 - auVar30[0xe];
      *(char *)((long)puVar2 + 0xf) = cVar17 - auVar30[0xf];
      uVar24 = uVar23 + 4;
      uVar22 = uVar23 + 8;
      uVar23 = uVar24;
    } while (uVar22 <= (uint)num_pixels);
  }
  iVar21 = num_pixels - (int)uVar24;
  if (iVar21 == 0) {
    return;
  }
  uVar24 = uVar24 & 0xffffffff;
  (*VP8LPredictorsSub_C[0xb])(in + uVar24,upper + uVar24,iVar21,out + uVar24);
  return;
}

Assistant:

static void PredictorSub11_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* WEBP_RESTRICT out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i pa, pb;
    GetSumAbsDiff32_SSE2(&T, &TL, &pa);   // pa = sum |T-TL|
    GetSumAbsDiff32_SSE2(&L, &TL, &pb);   // pb = sum |L-TL|
    {
      const __m128i mask = _mm_cmpgt_epi32(pb, pa);
      const __m128i A = _mm_and_si128(mask, L);
      const __m128i B = _mm_andnot_si128(mask, T);
      const __m128i pred = _mm_or_si128(A, B);    // pred = (L > T)? L : T
      const __m128i res = _mm_sub_epi8(src, pred);
      _mm_storeu_si128((__m128i*)&out[i], res);
    }
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[11](in + i, upper + i, num_pixels - i, out + i);
  }
}